

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O3

String * Rml::ComputeFontFamily(String *__return_storage_ptr__,String *font_family)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  String local_30;
  
  local_30._M_dataplus._M_p = (font_family->_M_dataplus)._M_p;
  paVar1 = &font_family->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p == paVar1) {
    local_30.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_30.field_2._8_8_ = *(undefined8 *)((long)&font_family->field_2 + 8);
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  }
  else {
    local_30.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_30._M_string_length = font_family->_M_string_length;
  (font_family->_M_dataplus)._M_p = (pointer)paVar1;
  font_family->_M_string_length = 0;
  (font_family->field_2)._M_local_buf[0] = '\0';
  StringUtilities::ToLower(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

String ComputeFontFamily(String font_family)
{
	return StringUtilities::ToLower(std::move(font_family));
}